

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted_aggregate_function.cpp
# Opt level: O2

void duckdb::SortedAggregateFunction::SimpleUpdate
               (Vector *inputs,AggregateInputData *aggr_input_data,idx_t input_count,
               data_ptr_t state,idx_t count)

{
  SortedAggregateBindData *other;
  DataChunk sort_input;
  DataChunk arg_input;
  SortedAggregateBindData order_bind;
  DataChunk local_280;
  DataChunk local_240;
  SortedAggregateBindData local_200;
  
  other = (SortedAggregateBindData *)
          optional_ptr<duckdb::FunctionData,_true>::operator->(&aggr_input_data->bind_data);
  SortedAggregateBindData::SortedAggregateBindData(&local_200,other);
  DataChunk::DataChunk(&local_240);
  DataChunk::DataChunk(&local_280);
  ProjectInputs(inputs,&local_200,input_count,count,&local_240,&local_280);
  SortedAggregateState::Update((SortedAggregateState *)state,aggr_input_data,&local_280,&local_240);
  DataChunk::~DataChunk(&local_280);
  DataChunk::~DataChunk(&local_240);
  SortedAggregateBindData::~SortedAggregateBindData(&local_200);
  return;
}

Assistant:

static void SimpleUpdate(Vector inputs[], AggregateInputData &aggr_input_data, idx_t input_count, data_ptr_t state,
	                         idx_t count) {
		const auto order_bind = aggr_input_data.bind_data->Cast<SortedAggregateBindData>();
		DataChunk arg_input;
		DataChunk sort_input;
		ProjectInputs(inputs, order_bind, input_count, count, arg_input, sort_input);

		const auto order_state = reinterpret_cast<SortedAggregateState *>(state);
		order_state->Update(aggr_input_data, sort_input, arg_input);
	}